

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cencode.c
# Opt level: O1

void rcnb_encode_short(unsigned_short value_in,wchar_t **value_out)

{
  wchar_t wVar1;
  wchar_t *pwVar2;
  uint uVar3;
  
  uVar3 = value_in & 0x7fff;
  if ((short)value_in < 0) {
    *value_out = *value_out + 2;
  }
  pwVar2 = *value_out;
  wVar1 = L"rRŔŕŖŗŘřƦȐȑȒȓɌɍ"[(ulong)uVar3 / 0x8ca];
  *value_out = pwVar2 + 1;
  *pwVar2 = wVar1;
  wVar1 = L"cCĆćĈĉĊċČčƇƈÇȻȼ"[((ulong)uVar3 % 0x8ca) / 0x96];
  *value_out = pwVar2 + 2;
  pwVar2[1] = wVar1;
  if ((short)value_in < 0) {
    *value_out = pwVar2 + -2;
  }
  pwVar2 = *value_out;
  wVar1 = L"nNŃńŅņŇňƝƞÑǸǹȠȵ"[((ulong)uVar3 % 0x96) / 10];
  *value_out = pwVar2 + 1;
  *pwVar2 = wVar1;
  wVar1 = L"bBƀƁƃƄƅßÞþ"[(ushort)(uVar3 % 10)];
  *value_out = pwVar2 + 2;
  pwVar2[1] = wVar1;
  if (-1 < (short)value_in) {
    return;
  }
  *value_out = pwVar2 + 4;
  return;
}

Assistant:

void rcnb_encode_short(unsigned short value_in, wchar_t** value_out)
{
    bool reverse = false;
    if (value_in > 0x7FFF) {
        reverse = true;
        value_in = (unsigned short)(value_in & 0x7FFF);
    }
    if (reverse)
        *value_out += 2;
    *(*value_out)++ = cr[value_in / scnb];
    *(*value_out)++ = cc[value_in % scnb / snb];
    if (reverse)
        *value_out -= 4;
    *(*value_out)++ = cn[value_in % snb / sb];
    *(*value_out)++ = cb[value_in % sb];
    if (reverse)
        *value_out += 2;
}